

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_key2text.c
# Opt level: O0

int ecx_to_text(BIO *out,void *key,int selection)

{
  int iVar1;
  uint in_EDX;
  BIO *in_RSI;
  BIO *in_RDI;
  char *type_label;
  ECX_KEY *ecx;
  char *in_stack_ffffffffffffffc0;
  uchar *in_stack_ffffffffffffffc8;
  char *file;
  int local_4;
  
  file = (char *)0x0;
  if ((in_RDI == (BIO *)0x0) || (in_RSI == (BIO *)0x0)) {
    ERR_new();
    ERR_set_debug(file,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),in_stack_ffffffffffffffc0);
    ERR_set_error(0x39,0xc0102,(char *)0x0);
    local_4 = 0;
  }
  else {
    if ((in_EDX & 1) == 0) {
      if ((in_EDX & 2) != 0) {
        if (((ulong)in_RSI->callback & 1) == 0) {
          ERR_new();
          ERR_set_debug(file,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                        in_stack_ffffffffffffffc0);
          ERR_set_error(0x39,0xdc,(char *)0x0);
          return 0;
        }
        in_stack_ffffffffffffffc0 = (char *)(ulong)(uint)in_RSI->num_read;
        switch(in_stack_ffffffffffffffc0) {
        case (char *)0x0:
          file = "X25519 Public-Key";
          break;
        case (char *)0x1:
          file = "X448 Public-Key";
          break;
        case (char *)0x2:
          file = "ED25519 Public-Key";
          break;
        case (char *)0x3:
          file = "ED448 Public-Key";
        }
      }
    }
    else {
      if (in_RSI->prev_bio == (bio_st *)0x0) {
        ERR_new();
        ERR_set_debug(file,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),in_stack_ffffffffffffffc0
                     );
        ERR_set_error(0x39,0xdd,(char *)0x0);
        return 0;
      }
      in_stack_ffffffffffffffc8 = (uchar *)(ulong)(uint)in_RSI->num_read;
      switch(in_stack_ffffffffffffffc8) {
      case (uchar *)0x0:
        file = "X25519 Private-Key";
        break;
      case (uchar *)0x1:
        file = "X448 Private-Key";
        break;
      case (uchar *)0x2:
        file = "ED25519 Private-Key";
        break;
      case (uchar *)0x3:
        file = "ED448 Private-Key";
      }
    }
    iVar1 = BIO_printf(in_RDI,"%s:\n",file);
    if (iVar1 < 1) {
      local_4 = 0;
    }
    else if (((in_EDX & 1) == 0) ||
            (iVar1 = print_labeled_buf(in_RSI,file,in_stack_ffffffffffffffc8,
                                       (size_t)in_stack_ffffffffffffffc0), iVar1 != 0)) {
      if (((in_EDX & 2) == 0) ||
         (iVar1 = print_labeled_buf(in_RSI,file,in_stack_ffffffffffffffc8,
                                    (size_t)in_stack_ffffffffffffffc0), iVar1 != 0)) {
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int ecx_to_text(BIO *out, const void *key, int selection)
{
    const ECX_KEY *ecx = key;
    const char *type_label = NULL;

    if (out == NULL || ecx == NULL) {
        ERR_raise(ERR_LIB_PROV, ERR_R_PASSED_NULL_PARAMETER);
        return 0;
    }

    if ((selection & OSSL_KEYMGMT_SELECT_PRIVATE_KEY) != 0) {
        if (ecx->privkey == NULL) {
            ERR_raise(ERR_LIB_PROV, PROV_R_NOT_A_PRIVATE_KEY);
            return 0;
        }

        switch (ecx->type) {
        case ECX_KEY_TYPE_X25519:
            type_label = "X25519 Private-Key";
            break;
        case ECX_KEY_TYPE_X448:
            type_label = "X448 Private-Key";
            break;
        case ECX_KEY_TYPE_ED25519:
            type_label = "ED25519 Private-Key";
            break;
        case ECX_KEY_TYPE_ED448:
            type_label = "ED448 Private-Key";
            break;
        }
    } else if ((selection & OSSL_KEYMGMT_SELECT_PUBLIC_KEY) != 0) {
        /* ecx->pubkey is an array, not a pointer... */
        if (!ecx->haspubkey) {
            ERR_raise(ERR_LIB_PROV, PROV_R_NOT_A_PUBLIC_KEY);
            return 0;
        }

        switch (ecx->type) {
        case ECX_KEY_TYPE_X25519:
            type_label = "X25519 Public-Key";
            break;
        case ECX_KEY_TYPE_X448:
            type_label = "X448 Public-Key";
            break;
        case ECX_KEY_TYPE_ED25519:
            type_label = "ED25519 Public-Key";
            break;
        case ECX_KEY_TYPE_ED448:
            type_label = "ED448 Public-Key";
            break;
        }
    }

    if (BIO_printf(out, "%s:\n", type_label) <= 0)
        return 0;
    if ((selection & OSSL_KEYMGMT_SELECT_PRIVATE_KEY) != 0
        && !print_labeled_buf(out, "priv:", ecx->privkey, ecx->keylen))
        return 0;
    if ((selection & OSSL_KEYMGMT_SELECT_PUBLIC_KEY) != 0
        && !print_labeled_buf(out, "pub:", ecx->pubkey, ecx->keylen))
        return 0;

    return 1;
}